

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> * __thiscall
cnn::Tensor::batch_elems
          (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__return_storage_ptr__,Tensor *this)

{
  undefined8 *puVar1;
  pointer pTVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  float *pfStack_90;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_48;
  
  uVar3 = (ulong)(this->d).bd;
  if (uVar3 == 1) {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (__return_storage_ptr__,1,this,(allocator_type *)&local_b8);
  }
  else {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (__return_storage_ptr__,uVar3,(allocator_type *)&local_b8);
    uVar3 = (ulong)(this->d).nd;
    iVar5 = 1;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        iVar5 = iVar5 * (this->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    local_68 = *(undefined8 *)(this->d).d;
    uStack_60 = *(undefined8 *)((this->d).d + 2);
    local_58 = *(undefined8 *)((this->d).d + 4);
    uStack_50 = *(undefined8 *)((this->d).d + 6);
    if ((this->d).bd != 0) {
      lVar6 = 0x40;
      uVar3 = 0;
      uVar4 = 0;
      do {
        pfStack_90 = this->v + uVar3;
        local_a8 = local_58;
        uStack_a0 = uStack_50;
        local_b8 = local_68;
        uStack_b0 = uStack_60;
        local_98 = 1;
        pTVar2 = (__return_storage_ptr__->
                 super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar6 + -0x20);
        *puVar1 = CONCAT44(uStack_94,1);
        puVar1[1] = pfStack_90;
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar6 + -0x30);
        *puVar1 = local_58;
        puVar1[1] = uStack_50;
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar6 + -0x40);
        *puVar1 = local_68;
        puVar1[1] = uStack_60;
        local_48.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)(pTVar2->d).d + lVar6);
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar6 + -0x10);
        local_48.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar1;
        local_48.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar1[1];
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar6 + -0x10);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)(pTVar2->d).d + lVar6) = 0;
        local_88.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_88);
        uVar4 = uVar4 + 1;
        lVar6 = lVar6 + 0x48;
        uVar3 = (ulong)(uint)((int)uVar3 + iVar5);
      } while (uVar4 < (this->d).bd);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tensor> batch_elems() const {
    if(d.batch_elems() == 1) {
      return std::vector<Tensor>(1, *this); 
    } else {
      std::vector<Tensor> bs(d.batch_elems());
      unsigned bsize = d.batch_size();
      Dim new_d = d; new_d.bd = 1;
      assert (d.batch_elems() >= 0);
      for(unsigned b = 0; b < d.batch_elems(); ++b)
        bs[b] = Tensor(new_d, v + bsize * b);
      return bs;
    }
  }